

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

TcParseTableBase * google::protobuf::Message::GetTcParseTableImpl(MessageLite *msg)

{
  Message *this;
  Reflection *this_00;
  TcParseTableBase *pTVar1;
  MessageLite *msg_local;
  
  this = DownCastMessage<google::protobuf::Message>(msg);
  this_00 = GetReflection(this);
  pTVar1 = Reflection::GetTcParseTable(this_00);
  return pTVar1;
}

Assistant:

const internal::TcParseTableBase* Message::GetTcParseTableImpl(
    const MessageLite& msg) {
  return DownCastMessage<Message>(msg).GetReflection()->GetTcParseTable();
}